

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O3

bool __thiscall
AmstradCPC::ConcreteMachine<true>::insert_media(ConcreteMachine<true> *this,Media *media)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  Drive *this_00;
  pointer psVar4;
  long lVar5;
  pointer psVar6;
  shared_ptr<Storage::Disk::Disk> local_58;
  shared_ptr<Storage::Tape::Tape> local_48;
  Media *local_38;
  
  psVar1 = (media->tapes).
           super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (media->tapes).
                super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar1->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar1->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Storage::Tape::TapePlayer::set_tape(&(this->tape_player_).super_TapePlayer,&local_48);
    if (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (this->allow_fast_tape_hack_ == true) {
      bVar3 = Storage::Tape::TapePlayer::has_tape(&(this->tape_player_).super_TapePlayer);
    }
    else {
      bVar3 = false;
    }
    this->use_fast_tape_hack_ = bVar3;
  }
  psVar4 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = media;
  psVar6 = psVar4;
  if (psVar4 != psVar2) {
    lVar5 = 0;
    do {
      local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)&(psVar4->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr + lVar5);
      local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(psVar4->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi + lVar5);
      if (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      this_00 = Storage::Disk::Controller::get_drive((Controller *)&this->fdc_);
      Storage::Disk::Drive::set_disk(this_00,&local_58);
      if (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    } while (((int)lVar5 != 0x30) &&
            (psVar6 = (pointer)((long)&psVar4[1].
                                       super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + lVar5), lVar5 = lVar5 + 0x10, psVar6 != psVar2));
    psVar4 = (local_38->disks).
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar6 = (local_38->disks).
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  return (local_38->tapes).
         super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (local_38->tapes).
         super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
         ._M_impl.super__Vector_impl_data._M_finish || psVar6 != psVar4;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			// If there are any tapes supplied, use the first of them.
			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
				set_use_fast_tape_hack();
			}

			// Insert up to four disks.
			int c = 0;
			for(auto &disk : media.disks) {
				fdc_.set_disk(disk, c);
				c++;
				if(c == 4) break;
			}

			return !media.tapes.empty() || (!media.disks.empty() && has_fdc);
		}